

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

objnum bif_get_optional_obj_arg(bifcxdef *ctx,int *rem_argc)

{
  uchar uVar1;
  runsdef *prVar2;
  runsdef *prVar3;
  
  if ((*rem_argc != 0) &&
     ((uVar1 = ctx->bifcxrun->runcxsp[-1].runstyp, uVar1 == '\x05' || (uVar1 == '\x02')))) {
    *rem_argc = *rem_argc + -1;
    prVar2 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar2 + -1;
    prVar3 = ctx->bifcxrun->runcxsp;
    if (prVar2[-1].runstyp == '\x02') {
      return (prVar3->runsv).runsvobj;
    }
    if (prVar3->runstyp != '\x05') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3f2);
    }
  }
  return 0xffff;
}

Assistant:

static objnum bif_get_optional_obj_arg(bifcxdef *ctx, int *rem_argc)
{
    /* if we're out of arguments, there's no object value */
    if (*rem_argc == 0)
        return MCMONINV;

    /* 
     *   if the next argument is not an object or nil, we're out of object
     *   arguments 
     */
    if (runtostyp(ctx->bifcxrun) != DAT_OBJECT
        && runtostyp(ctx->bifcxrun) != DAT_NIL)
        return MCMONINV;

    /* we have an object - remove it from the remaining argument count */
    --(*rem_argc);

    /* pop and return the object value */
    return runpopobjnil(ctx->bifcxrun);
}